

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void operator_bool_suite::test_null(void)

{
  undefined1 local_55 [13];
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_d [2];
  undefined1 local_b;
  undefined1 local_a [2];
  
  local_a[0] = 0;
  local_b = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(null)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20d1,"void operator_bool_suite::test_null()",local_a,&local_b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48);
  local_d[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_48);
  local_55[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20d2,"void operator_bool_suite::test_null()",local_d,local_55);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  return;
}

Assistant:

void test_null()
{
    TRIAL_PROTOCOL_TEST_EQUAL(bool(null), false);
    TRIAL_PROTOCOL_TEST_EQUAL(bool(variable()), false);
}